

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::LineCase
          (LineCase *this,Context *context,char *name,char *description,
          ColorlessLineData *linesBegin,ColorlessLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport,int searchKernelSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  ColoredLineData *__result;
  ColoredLineData *pCVar5;
  ColoredLineData *__last;
  allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
  *paVar6;
  size_t __n;
  pointer pCVar7;
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *this_00;
  ColoredLineData *__first;
  pointer __p;
  long lVar8;
  ColoredLineData local_78;
  
  RenderTestCase::RenderTestCase((RenderTestCase *)this,context,name,description);
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00c21f18;
  (this->super_LineRenderTestCase).m_lineWidth = lineWidth;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar7 = (pointer)0x0;
  __last = (ColoredLineData *)0x0;
  __first = (ColoredLineData *)0x0;
  do {
    __p = &local_78;
    if (linesBegin == linesEnd) {
      (this->super_LineRenderTestCase).m_lines.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ._M_impl.super__Vector_impl_data._M_start = __first;
      iVar1 = viewport->bottom;
      iVar2 = viewport->width;
      iVar3 = viewport->height;
      (this->super_LineRenderTestCase).m_viewport.left = viewport->left;
      (this->super_LineRenderTestCase).m_viewport.bottom = iVar1;
      (this->super_LineRenderTestCase).m_viewport.width = iVar2;
      (this->super_LineRenderTestCase).m_viewport.height = iVar3;
      (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.
      super_TestNode._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_00c21ea0;
      this->m_searchKernelSize = searchKernelSize;
      return;
    }
    tcu::Vector<float,_4>::Vector(&__p->p0);
    tcu::Vector<float,_4>::Vector(&local_78.c0);
    tcu::Vector<float,_4>::Vector(&local_78.p1);
    tcu::Vector<float,_4>::Vector(&local_78.c1);
    local_78.p0.m_data._0_8_ = *(undefined8 *)(linesBegin->p0).m_data;
    local_78.p0.m_data._8_8_ = *(undefined8 *)((linesBegin->p0).m_data + 2);
    local_78.c0.m_data[0] = 1.0;
    local_78.c0.m_data[1] = 1.0;
    local_78.c0.m_data[2] = 1.0;
    local_78.c0.m_data[3] = 1.0;
    local_78.p1.m_data._0_8_ = *(undefined8 *)(linesBegin->p1).m_data;
    local_78.p1.m_data._8_8_ = *(undefined8 *)((linesBegin->p1).m_data + 2);
    local_78.c1.m_data[0] = 1.0;
    local_78.c1.m_data[1] = 1.0;
    local_78.c1.m_data[2] = 1.0;
    local_78.c1.m_data[3] = 1.0;
    if (__last == pCVar7) {
      lVar8 = (long)pCVar7 - (long)__first;
      if (lVar8 == 0x7fffffffffffffc0) {
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_start = __first;
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      __p = (pointer)(lVar8 >> 6);
      pCVar4 = __p;
      if (pCVar7 == __first) {
        pCVar4 = (pointer)0x1;
      }
      this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 *)((long)(pCVar4->p0).m_data + (long)(__p->p0).m_data);
      paVar6 = (allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
                *)0x1ffffffffffffff;
      if ((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
           *)0x1fffffffffffffe < this_00) {
        this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                   *)0x1ffffffffffffff;
      }
      if (CARRY8((ulong)pCVar4,(ulong)__p)) {
        this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                   *)0x1ffffffffffffff;
      }
      __result = std::
                 _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 ::_M_allocate(this_00,(size_t)context);
      LineRenderTestCase::ColoredLineData::ColoredLineData
                ((ColoredLineData *)(lVar8 + (long)__result),&local_78);
      pCVar5 = std::
               __uninitialized_copy_a<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const*,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData*,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
                         (__first,__last,__result,paVar6);
      __last = std::
               __uninitialized_copy_a<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const*,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData*,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>
                         (__last,__last,pCVar5 + 1,paVar6);
      std::
      _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ::_M_deallocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                       *)__first,__p,__n);
      (this->super_LineRenderTestCase).m_lines.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ._M_impl.super__Vector_impl_data._M_finish = __last;
      pCVar7 = __result + (long)this_00;
      (this->super_LineRenderTestCase).m_lines.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar7;
    }
    else {
      LineRenderTestCase::ColoredLineData::ColoredLineData(__last,__p);
      __last = __last + 1;
      (this->super_LineRenderTestCase).m_lines.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
      ._M_impl.super__Vector_impl_data._M_finish = __last;
      __result = __first;
    }
    linesBegin = linesBegin + 1;
    context = (Context *)__p;
    __first = __result;
  } while( true );
}

Assistant:

LineCase::LineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColorlessLineData* linesBegin, const LineRenderTestCase::ColorlessLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport, int searchKernelSize)
	: LineRenderTestCase	(context, name, description, linesBegin, linesEnd, lineWidth, viewport)
	, m_searchKernelSize	(searchKernelSize)
{
}